

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_init2(__mpz_struct *r,mp_bitcnt_t bits)

{
  mp_limb_t *pmVar1;
  ulong uVar2;
  
  uVar2 = (bits - 1) + (ulong)(bits == 0) >> 6;
  r->_mp_alloc = (int)uVar2 + 1;
  r->_mp_size = 0;
  pmVar1 = (mp_limb_t *)(*gmp_allocate_func)(uVar2 * 8 + 8);
  r->_mp_d = pmVar1;
  return;
}

Assistant:

void
mpz_init2 (mpz_t r, mp_bitcnt_t bits)
{
  mp_size_t rn;

  bits -= (bits != 0);		/* Round down, except if 0 */
  rn = 1 + bits / GMP_LIMB_BITS;

  r->_mp_alloc = rn;
  r->_mp_size = 0;
  r->_mp_d = gmp_xalloc_limbs (rn);
}